

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TTypeParameters::operator==(TTypeParameters *this,TTypeParameters *rhs)

{
  bool bVar1;
  bool local_22;
  bool same;
  TTypeParameters *rhs_local;
  TTypeParameters *this_local;
  
  local_22 = false;
  if (this->basicType == rhs->basicType) {
    local_22 = TArraySizes::operator==(this->arraySizes,rhs->arraySizes);
  }
  if ((local_22 == false) || (this->basicType != EbtSpirvType)) {
    this_local._7_1_ = local_22;
  }
  else {
    bVar1 = false;
    if (this->spirvType != (TSpirvType *)0x0) {
      bVar1 = rhs->spirvType != (TSpirvType *)0x0;
    }
    if (!bVar1) {
      __assert_fail("spirvType && rhs.spirvType",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x59c,
                    "bool glslang::TTypeParameters::operator==(const TTypeParameters &) const");
    }
    this_local._7_1_ = TSpirvType::operator==(this->spirvType,rhs->spirvType);
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const TTypeParameters& rhs) const
    {
        bool same = basicType == rhs.basicType && *arraySizes == *rhs.arraySizes;
        if (same && basicType == EbtSpirvType) {
            assert(spirvType && rhs.spirvType);
            return *spirvType == *rhs.spirvType;
        }
        return same;
    }